

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O1

handle pybind11::detail::type_caster<Eigen::Matrix<double,1,2,1,1,2>,void>::
       cast_impl<Eigen::Matrix<double,1,2,1,1,2>const>
                 (Matrix<double,_1,_2,_1,_1,_2> *src,return_value_policy policy,handle parent)

{
  double dVar1;
  Matrix<double,_1,_2,_1,_1,_2> *pMVar2;
  handle hVar3;
  cast_error *this;
  bool writeable;
  undefined7 in_register_00000031;
  object local_18;
  
  switch(CONCAT71(in_register_00000031,policy) & 0xffffffff) {
  case 0:
  case 2:
    break;
  case 1:
  case 5:
    local_18.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar3 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,2,1,1,2>>>
                      (src,(PyObject *)&_Py_NoneStruct,false);
    object::~object(&local_18);
    return (handle)hVar3.m_ptr;
  case 3:
    parent.m_ptr = (PyObject *)0x0;
    writeable = true;
    goto LAB_0020d104;
  case 4:
    pMVar2 = (Matrix<double,_1,_2,_1,_1,_2> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)0x10,
                        CONCAT71(in_register_00000031,policy));
    dVar1 = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
            array[1];
    (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[0]
         = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
    (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[1]
         = dVar1;
    src = pMVar2;
    break;
  case 6:
    writeable = false;
LAB_0020d104:
    hVar3 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,2,1,1,2>>>
                      (src,parent,writeable);
    return (handle)hVar3.m_ptr;
  default:
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,"unhandled return_value_policy: should not happen!");
    __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  hVar3 = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,2,1,1,2>>,Eigen::Matrix<double,1,2,1,1,2>const,void>
                    (src);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(CType *src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::take_ownership:
            case return_value_policy::automatic:
                return eigen_encapsulate<props>(src);
            case return_value_policy::move:
                return eigen_encapsulate<props>(new CType(std::move(*src)));
            case return_value_policy::copy:
                return eigen_array_cast<props>(*src);
            case return_value_policy::reference:
            case return_value_policy::automatic_reference:
                return eigen_ref_array<props>(*src);
            case return_value_policy::reference_internal:
                return eigen_ref_array<props>(*src, parent);
            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        };
    }